

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void waitForReaderResponseAndSendQueued(WS_ReaderInfo Reader)

{
  __pid_t _Var1;
  pthread_t pVar2;
  CPTimestepList in_RDI;
  SstStream unaff_retaddr;
  CPTimestepList List;
  ssize_t TS;
  SstStream Stream;
  CPTimestepList local_20;
  _TimestepMetadataMsg *p_Var3;
  SstStream s;
  SstStream p_Var4;
  
  s = (SstStream)in_RDI->Timestep;
  pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
  while ((int)(in_RDI->Data).DataSize == 1) {
    p_Var4 = s;
    _Var1 = getpid();
    pVar2 = pthread_self();
    CP_verbose(s,PerRankVerbose,"(PID %lx, TID %lx) Waiting for Reader ready on WSR %p.\n",
               (long)_Var1,pVar2,in_RDI);
    pthread_cond_wait((pthread_cond_t *)&p_Var4->DataCondition,(pthread_mutex_t *)&p_Var4->DataLock)
    ;
    s = p_Var4;
  }
  if ((int)(in_RDI->Data).DataSize != 2) {
    CP_verbose(s,CriticalVerbose,"Reader WSR %p, Failed during startup.\n",in_RDI);
    pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
  }
  in_RDI->FreeClientData = in_RDI->Msg;
  CP_verbose(s,PerStepVerbose,
             "Reader ready on WSR %p, Stream established, Starting %ld LastProvided %ld.\n",in_RDI,
             in_RDI->Msg,s->LastProvidedTimestep);
  if (s->ConfigParams->StepDistributionMode == 0) {
    for (p_Var3 = in_RDI->Msg; (long)p_Var3 <= s->LastProvidedTimestep;
        p_Var3 = (_TimestepMetadataMsg *)((long)&p_Var3->RS_Stream + 1)) {
      local_20 = s->QueuedTimesteps;
      while ((local_20 != (CPTimestepList)0x0 &&
             (CP_verbose(s,TraceVerbose,"In send queued, trying to send TS %ld, examining TS %ld\n",
                         p_Var3,local_20->Timestep), (int)(in_RDI->Data).DataSize == 2))) {
        if ((_TimestepMetadataMsg *)local_20->Timestep == p_Var3) {
          if ((local_20->Expired == 0) || (local_20->PreciousTimestep != 0)) {
            CP_verbose(s,PerStepVerbose,
                       "Sending Queued TimestepMetadata for timestep %ld, reference count = %d\n",
                       p_Var3,(ulong)(uint)local_20->ReferenceCount);
            SendTimestepEntryToSingleReader
                      (unaff_retaddr,in_RDI,(WS_ReaderInfo)s,(int)((ulong)p_Var3 >> 0x20));
            goto LAB_00f524cc;
          }
          CP_verbose(s,TraceVerbose,
                     "Reader send queued skipping  TS %ld, expired and not precious\n",
                     local_20->Timestep,p_Var3);
          local_20 = local_20->Next;
        }
        else {
LAB_00f524cc:
          local_20 = local_20->Next;
        }
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
  return;
}

Assistant:

static void waitForReaderResponseAndSendQueued(WS_ReaderInfo Reader)
{
    SstStream Stream = Reader->ParentStream;
    STREAM_MUTEX_LOCK(Stream);
    while (Reader->ReaderStatus == Opening)
    {
        CP_verbose(Stream, PerRankVerbose,
                   "(PID %lx, TID %lx) Waiting for Reader ready on WSR %p.\n", (long)getpid(),
                   (long)gettid(), Reader);
        STREAM_CONDITION_WAIT(Stream);
    }

    if (Reader->ReaderStatus != Established)
    {
        CP_verbose(Stream, CriticalVerbose, "Reader WSR %p, Failed during startup.\n",
                   (void *)Reader);
        STREAM_MUTEX_UNLOCK(Stream);
    }
    /* LOCK */
    /* LastReleased is set to OldestItemTS - 1 */
    /* foreach item in queue */
    /*       if (reader is established) */
    /*           if TS is expired CONTINUE */
    /*          increment TS reference count */
    /* 	 update readers LastSent */
    /*          UNLOCK */
    /*          write event to reader (might cause connection closed) */
    /*          LOCK */
    /*       } */
    /*    } */
    /* } */
    /* UNLOCK */

    /* send any queued metadata necessary */
    Reader->OldestUnreleasedTimestep = Reader->StartingTimestep;
    CP_verbose(Stream, PerStepVerbose,
               "Reader ready on WSR %p, Stream established, Starting %ld "
               "LastProvided %ld.\n",
               Reader, Reader->StartingTimestep, Stream->LastProvidedTimestep);
    if (Stream->ConfigParams->StepDistributionMode == StepsAllToAll)
    {
        for (ssize_t TS = Reader->StartingTimestep; TS <= Stream->LastProvidedTimestep; TS++)
        {
            CPTimestepList List = Stream->QueuedTimesteps;
            while (List)
            {
                CP_verbose(Stream, TraceVerbose,
                           "In send queued, trying to send TS %ld, examining TS %ld\n", TS,
                           List->Timestep);
                if (Reader->ReaderStatus != Established)
                {
                    break; /* break out of while if we've fallen out of
                            * established
                            */
                }
                if (List->Timestep == TS)
                {
                    if (List->Expired && !List->PreciousTimestep)
                    {
                        CP_verbose(Stream, TraceVerbose,
                                   "Reader send queued skipping  TS %ld, expired "
                                   "and not precious\n",
                                   List->Timestep, TS);
                        List = List->Next;
                        continue; /* skip timestep is expired, but not
                                     precious */
                    }
                    CP_verbose(Stream, PerStepVerbose,
                               "Sending Queued TimestepMetadata for timestep %ld, "
                               "reference count = %d\n",
                               TS, List->ReferenceCount);

                    SendTimestepEntryToSingleReader(Stream, List, Reader, -1);
                }
                List = List->Next;
            }
        }
    }
    STREAM_MUTEX_UNLOCK(Stream);
}